

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_opts.c
# Opt level: O0

int field_opts_off(FIELD *field,Field_Options opts)

{
  int iVar1;
  int *piVar2;
  FIELD *local_20;
  int res;
  Field_Options opts_local;
  FIELD *field_local;
  
  local_20 = field;
  if (field == (FIELD *)0x0) {
    local_20 = _nc_Default_Field;
  }
  iVar1 = _nc_Synchronize_Options(local_20,local_20->opts & (opts & 0x3ffU ^ 0xffffffff));
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  return iVar1;
}

Assistant:

int field_opts_off(FIELD  * field, Field_Options opts)
{
  int res = E_BAD_ARGUMENT;

  opts &= ALL_FIELD_OPTS;
  if (!(opts & ~ALL_FIELD_OPTS))
    {
      Normalize_Field( field );
      res = _nc_Synchronize_Options( field, field->opts & ~opts );
    }
  RETURN(res);
}